

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfw_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  LumeviewError *this;
  FileNotFoundError *e;
  exception *e_1;
  int frmBufHeight;
  int frmBufWidth;
  allocator local_219;
  string local_218 [32];
  SPScene local_1f8;
  undefined1 local_1e1;
  string local_1e0 [32];
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [376];
  GLFWwindow *local_38;
  GLFWwindow *window;
  int local_1c;
  char **ppcStack_18;
  int retVal;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  glfwSetErrorCallback(HandleGLFWError);
  glfwInit();
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22008,0x32001);
  local_38 = glfwCreateWindow(800,600,"lumeview",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (local_38 == (GLFWwindow *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar3 = std::operator<<(local_1b0,"GLFW::INIT\n");
    std::operator<<(poVar3,"Failed to create glfw window");
    local_1e1 = 1;
    this = (LumeviewError *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringstream::str();
    lumeview::LumeviewError::LumeviewError(this,local_1e0);
    local_1e1 = 0;
    __cxa_throw(this,&lumeview::LumeviewError::typeinfo,lumeview::LumeviewError::~LumeviewError);
  }
  glfwMakeContextCurrent(local_38);
  glfwSwapInterval(1);
  lumeview::LumeviewInit();
  if ((int)argv_local == 2) {
    pcVar1 = ppcStack_18[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,pcVar1,&local_219);
    lumeview::CreateSceneForMesh((lumeview *)&local_1f8,(string *)local_218);
    lumeview::Lumeview::set_scene(&g_lumeview,&local_1f8);
    std::shared_ptr<lumeview::Scene>::~shared_ptr(&local_1f8);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
  }
  else {
    lumeview::CreateSampleScene();
    lumeview::Lumeview::set_scene(&g_lumeview,(SPScene *)&frmBufHeight);
    std::shared_ptr<lumeview::Scene>::~shared_ptr((shared_ptr<lumeview::Scene> *)&frmBufHeight);
  }
  InitImGui(local_38);
  glfwSetCursorPosCallback(local_38,CursorPositionCallback);
  glfwSetMouseButtonCallback(local_38,MouseButtonCallback);
  glfwSetScrollCallback(local_38,ScrollCallback);
  glfwSetKeyCallback(local_38,KeyCallback);
  glfwSetCharCallback(local_38,CharCallback);
  glfwGetFramebufferSize(local_38,(int *)((long)&e_1 + 4),(int *)&e_1);
  FramebufferResized(local_38,e_1._4_4_,(int)e_1);
  glfwSetFramebufferSizeCallback(local_38,FramebufferResized);
  while( true ) {
    iVar2 = glfwWindowShouldClose(local_38);
    if (iVar2 != 0) break;
    lumeview::Lumeview::process_gui(&g_lumeview);
    lumeview::Lumeview::render(&g_lumeview);
    glfwSwapBuffers(local_38);
    glfwPollEvents();
  }
  lumeview::Lumeview::clear(&g_lumeview);
  lumeview::LumeviewShutdown();
  glfwTerminate();
  return local_1c;
}

Assistant:

int main (int argc, char** argv)
{
	int retVal = 0;

	try {
		glfwSetErrorCallback (HandleGLFWError);
		glfwInit ();
		glfwWindowHint (GLFW_CONTEXT_VERSION_MAJOR, USE_GL_VERSION_MAJOR);
		glfwWindowHint (GLFW_CONTEXT_VERSION_MINOR, USE_GL_VERSION_MINOR);
		if((USE_GL_VERSION_MAJOR >= 3) && (USE_GL_VERSION_MINOR >= 2))
			glfwWindowHint (GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	//	add for OSX:
		#ifdef __APPLE__
			glfwWindowHint (GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
		#endif

	//	Set up window
		GLFWwindow* window = glfwCreateWindow (800, 600, "lumeview", NULL, NULL);
		COND_THROW (window == NULL, "GLFW::INIT\n" <<
		            "Failed to create glfw window");

		glfwMakeContextCurrent (window);
		glfwSwapInterval(1);

		LumeviewInit ();
		
	//	if a filename was specified, we'll load that, if not, we'll create a sample scene
		if (argc == 2)
			g_lumeview.set_scene (CreateSceneForMesh (argv[1]));
		else
			g_lumeview.set_scene (CreateSampleScene ());

	    InitImGui (window);

	    glfwSetCursorPosCallback (window, CursorPositionCallback);
	    glfwSetMouseButtonCallback (window, MouseButtonCallback);
	    glfwSetScrollCallback (window, ScrollCallback);
	    glfwSetKeyCallback (window, KeyCallback);
	    glfwSetCharCallback (window, CharCallback);

	//	setup view
	    int frmBufWidth, frmBufHeight;
	    glfwGetFramebufferSize (window, &frmBufWidth, &frmBufHeight);
		FramebufferResized (window, frmBufWidth, frmBufHeight);
		glfwSetFramebufferSizeCallback (window, FramebufferResized);

		while (!glfwWindowShouldClose (window))
		{
			g_lumeview.process_gui ();
			g_lumeview.render ();
			
			glfwSwapBuffers (window);
			glfwPollEvents ();
		}

	} catch (FileNotFoundError& e) {
		cout << "\nAn ERROR occurred during execution:\n";
		cout << "File not found: " << e.what() << endl << endl;
		retVal = 1;
	}
	catch (std::exception& e) {
		cout << "\nAn ERROR occurred during execution:\n";
		cout << e.what() << endl << endl;
		retVal = 1;
	}

	g_lumeview.clear();
	lumeview::LumeviewShutdown ();
	glfwTerminate ();
	return retVal;
}